

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateDeflection(ChElementShellANCF_3423 *this,double *def)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar4 = 0.0;
  lVar3 = 0;
  auVar7 = ZEXT816(0) << 0x40;
  do {
    pdVar1 = (double *)
             ((long)(this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + lVar3);
    auVar6._0_8_ = auVar7._0_8_ + *pdVar1;
    auVar6._8_8_ = auVar7._8_8_ + pdVar1[1];
    dVar4 = dVar4 + *(double *)
                     ((long)(this->m_d0).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array + lVar3 + 0x10);
    lVar3 = lVar3 + 0x30;
    auVar7 = auVar6;
  } while (lVar3 != 0xc0);
  dVar8 = 0.0;
  lVar3 = 0;
  auVar7 = ZEXT816(0) << 0x40;
  do {
    pdVar1 = (double *)
             ((long)(this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + lVar3);
    auVar10._0_8_ = auVar7._0_8_ + *pdVar1;
    auVar10._8_8_ = auVar7._8_8_ + pdVar1[1];
    dVar8 = dVar8 + *(double *)
                     ((long)(this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>
                            .m_storage.m_data.array + lVar3 + 0x10);
    lVar3 = lVar3 + 0x30;
    auVar7 = auVar10;
  } while (lVar3 != 0xc0);
  auVar6 = vsubpd_avx(auVar10,auVar6);
  auVar7 = vshufpd_avx(auVar6,auVar6,1);
  dVar2 = auVar7._0_8_ * 0.25;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar6._0_8_ * 0.25;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2 * dVar2;
  auVar7 = vfmadd231sd_fma(auVar9,auVar7,auVar7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (dVar8 - dVar4) * 0.25;
  auVar7 = vfmadd231sd_fma(auVar7,auVar5,auVar5);
  auVar7 = vsqrtsd_avx(auVar7,auVar7);
  *def = auVar7._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateDeflection(double& def) {
    ChVector<> oldPos;
    ChVector<> newPos;
    ChVector<> defVec;

    for (int i = 0; i < 4; i++) {
        oldPos.x() += this->m_d0(2 * i, 0);
        oldPos.y() += this->m_d0(2 * i, 1);
        oldPos.z() += this->m_d0(2 * i, 2);
    }

    for (int i = 0; i < 4; i++) {
        newPos.x() += this->m_d(2 * i, 0);
        newPos.y() += this->m_d(2 * i, 1);
        newPos.z() += this->m_d(2 * i, 2);
    }

    defVec = (newPos - oldPos) / 4;
    def = defVec.Length();
}